

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

bool __thiscall QGraphicsScene::event(QGraphicsScene *this,QEvent *event)

{
  int *piVar1;
  int iVar2;
  QGraphicsScenePrivate *this_00;
  qreal qVar3;
  undefined1 uVar4;
  bool bVar5;
  char cVar6;
  ushort uVar7;
  uint uVar8;
  QGraphicsScenePrivate *d;
  QWidget *viewport;
  ulong uVar9;
  QGraphicsItem *pQVar10;
  QGraphicsItem *pQVar11;
  QList<QGraphicsItem_*> *__range4;
  long lVar12;
  undefined8 uVar13;
  QGraphicsSceneHoverEvent *hoverEvent;
  long lVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QPointF QVar16;
  QRectF local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  uVar7 = *(ushort *)(event + 8);
  if ((uVar7 - 0x9b < 0x2a) && ((0x380000000efU >> ((ulong)(uVar7 - 0x9b) & 0x3f) & 1) != 0)) {
    QList<QGraphicsItem_*>::clear(&this_00->cachedItemsUnderMouse);
    uVar7 = *(ushort *)(event + 8);
  }
  bVar15 = true;
  switch(uVar7) {
  case 0x9b:
    QVar16 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)event);
    (this_00->lastSceneMousePos).xp = QVar16.xp;
    (this_00->lastSceneMousePos).yp = QVar16.yp;
    (**(code **)(*(long *)this + 0xc0))(this,event);
    break;
  case 0x9c:
    (**(code **)(*(long *)this + 0xb8))(this,event);
    break;
  case 0x9d:
    (**(code **)(*(long *)this + 200))(this,event);
    break;
  case 0x9e:
    (**(code **)(*(long *)this + 0xd0))(this,event);
    break;
  case 0x9f:
    (**(code **)(*(long *)this + 0x68))(this,event);
    break;
  case 0xa0:
  case 0xa1:
  case 0xa2:
    QVar16 = QGraphicsSceneHoverEvent::scenePos((QGraphicsSceneHoverEvent *)event);
    (this_00->lastSceneMousePos).xp = QVar16.xp;
    (this_00->lastSceneMousePos).yp = QVar16.yp;
    QGraphicsScenePrivate::dispatchHoverEvent(this_00,(QGraphicsSceneHoverEvent *)event);
    break;
  case 0xa3:
    (**(code **)(*(long *)this + 0xa0))(this,event);
    break;
  case 0xa4:
    (**(code **)(*(long *)this + 0x70))(this,event);
    break;
  case 0xa5:
    (**(code **)(*(long *)this + 0x78))(this,event);
    break;
  case 0xa6:
    (**(code **)(*(long *)this + 0x80))(this,event);
    break;
  case 0xa7:
    (**(code **)(*(long *)this + 0x88))(this,event);
    break;
  case 0xa8:
    (**(code **)(*(long *)this + 0xd8))(this,event);
    break;
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc5:
switchD_00598c83_caseD_a9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar4 = QObject::event((QEvent *)this);
      return (bool)uVar4;
    }
    goto LAB_00599212;
  case 0xc2:
  case 0xc3:
  case 0xc4:
    QGraphicsScenePrivate::touchEventHandler(this_00,(QTouchEvent *)event);
    break;
  case 0xc6:
switchD_00598c83_caseD_c6:
    QGraphicsScenePrivate::gestureEventHandler(this_00,(QGestureEvent *)event);
    break;
  default:
    switch(uVar7) {
    case 6:
      if (((this_00->focusItem == (QGraphicsItem *)0x0) &&
          (*(int *)(event + 0x40) + 0xfeffffffU < 2)) &&
         (uVar9 = QKeyEvent::modifiers(), (uVar9 & 0xc000000) == 0)) {
        if (*(int *)(event + 0x40) == 0x1000002) {
LAB_005991f9:
          lVar12 = *(long *)this;
          uVar13 = 0;
LAB_00599201:
          cVar6 = (**(code **)(lVar12 + 0x100))(this,uVar13);
          if (cVar6 != '\0') break;
        }
        else if (*(int *)(event + 0x40) == 0x1000001) {
          uVar8 = QKeyEvent::modifiers();
          if ((uVar8 >> 0x19 & 1) != 0) goto LAB_005991f9;
          if (*(int *)(event + 0x40) != 0x1000001) goto LAB_0059920b;
          lVar12 = *(long *)this;
          uVar13 = 1;
          goto LAB_00599201;
        }
LAB_0059920b:
        event[0xc] = (QEvent)0x0;
      }
      else {
        (**(code **)(*(long *)this + 0xa8))(this,event);
      }
      break;
    case 7:
      (**(code **)(*(long *)this + 0xb0))(this,event);
      break;
    case 8:
      (**(code **)(*(long *)this + 0x90))(this,event);
      break;
    case 9:
      (**(code **)(*(long *)this + 0x98))(this,event);
      break;
    case 10:
      goto switchD_00598c83_caseD_a9;
    case 0xb:
      break;
    default:
      if (uVar7 == 0x18) {
        iVar2 = this_00->activationRefCount;
        this_00->activationRefCount = iVar2 + 1;
        if (iVar2 == 0) {
          pQVar10 = this_00->lastActivePanel;
          if (pQVar10 == (QGraphicsItem *)0x0) {
            if ((this_00->tabFocusFirst == (QGraphicsWidget *)0x0) ||
               (bVar5 = QGraphicsItem::isPanel
                                  (&(this_00->tabFocusFirst->super_QGraphicsObject).
                                    super_QGraphicsItem), !bVar5)) {
              local_48 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
              QEvent::QEvent((QEvent *)&local_48,WindowActivate);
              local_68.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_68.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_68.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
                        (&local_68,*(long **)(*(long *)(this + 8) + 0x88),1);
              qVar3 = local_68.yp;
              lVar12 = (long)local_68.w << 3;
              for (lVar14 = 0; lVar12 != lVar14; lVar14 = lVar14 + 8) {
                pQVar10 = *(QGraphicsItem **)((long)qVar3 + lVar14);
                bVar5 = QGraphicsItem::isVisible(pQVar10);
                if (((bVar5) && (bVar5 = QGraphicsItem::isPanel(pQVar10), !bVar5)) &&
                   (pQVar11 = QGraphicsItem::parentItem(pQVar10), pQVar11 == (QGraphicsItem *)0x0))
                {
                  sendEvent(this,pQVar10,(QEvent *)&local_48);
                }
              }
              goto LAB_00599191;
            }
            pQVar10 = &(this_00->tabFocusFirst->super_QGraphicsObject).super_QGraphicsItem;
            if (this_00->tabFocusFirst == (QGraphicsWidget *)0x0) {
              pQVar10 = (QGraphicsItem *)0x0;
            }
          }
          QGraphicsScenePrivate::setActivePanelHelper(this_00,pQVar10,true);
        }
      }
      else if (uVar7 == 0x19) {
        piVar1 = &this_00->activationRefCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          pQVar10 = this_00->activePanel;
          if (pQVar10 == (QGraphicsItem *)0x0) {
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
            QEvent::QEvent((QEvent *)&local_48,WindowDeactivate);
            local_68.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
            local_68.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
            local_68.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
            (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
                      (&local_68,*(long **)(*(long *)(this + 8) + 0x88),1);
            qVar3 = local_68.yp;
            lVar12 = (long)local_68.w << 3;
            for (lVar14 = 0; lVar12 != lVar14; lVar14 = lVar14 + 8) {
              pQVar10 = *(QGraphicsItem **)((long)qVar3 + lVar14);
              bVar5 = QGraphicsItem::isVisible(pQVar10);
              if (((bVar5) && (bVar5 = QGraphicsItem::isPanel(pQVar10), !bVar5)) &&
                 (pQVar11 = QGraphicsItem::parentItem(pQVar10), pQVar11 == (QGraphicsItem *)0x0)) {
                sendEvent(this,pQVar10,(QEvent *)&local_48);
              }
            }
LAB_00599191:
            QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer
                      ((QArrayDataPointer<QGraphicsItem_*> *)&local_68);
            QEvent::~QEvent((QEvent *)&local_48);
          }
          else {
            QGraphicsScenePrivate::setActivePanelHelper(this_00,(QGraphicsItem *)0x0,true);
            this_00->lastActivePanel = pQVar10;
          }
        }
      }
      else if (uVar7 == 0x24) {
        QGraphicsScenePrivate::resolveFont(this_00);
      }
      else if (uVar7 == 0x26) {
        QGraphicsScenePrivate::resolvePalette(this_00);
      }
      else if (uVar7 == 0x27) {
LAB_00598d95:
        local_68.w = 0.0;
        local_68.h = 0.0;
        local_68.xp = 0.0;
        local_68.yp = 0.0;
        update(this,&local_68);
      }
      else if (uVar7 == 0x33) {
        pQVar10 = *(QGraphicsItem **)
                   (*(long *)(this + 8) + 0x188 +
                   (ulong)(*(int *)(*(long *)(this + 8) + 0x1b8) < 1) * 0x10);
        while ((bVar15 = pQVar10 != (QGraphicsItem *)0x0, bVar15 &&
               (QGraphicsScenePrivate::sendEvent(this_00,pQVar10,event), event[0xc] == (QEvent)0x0))
              ) {
          pQVar10 = QGraphicsItem::parentItem(pQVar10);
        }
      }
      else {
        if (uVar7 != 0x53) {
          if ((uVar7 != 0x61) && (uVar7 != 100)) {
            if (uVar7 == 0xca) goto switchD_00598c83_caseD_c6;
            if (uVar7 != 0xd5) {
              if (uVar7 != 0xdc) goto switchD_00598c83_caseD_a9;
              viewport = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)event);
              QGraphicsScenePrivate::leaveScene(this_00,viewport);
              break;
            }
          }
          goto LAB_00598d95;
        }
        (**(code **)(*(long *)this + 0xe0))(this,event);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar15;
  }
LAB_00599212:
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScene::event(QEvent *event)
{
    Q_D(QGraphicsScene);

    switch (event->type()) {
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick:
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverLeave:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        // Reset the under-mouse list to ensure that this event gets fresh
        // item-under-mouse data. Be careful about this list; if people delete
        // items from inside event handlers, this list can quickly end up
        // having stale pointers in it. We need to clear it before dispatching
        // events that use it.
        // ### this should only be cleared if we received a new mouse move event,
        // which relies on us fixing the replay mechanism in QGraphicsView.
        d->cachedItemsUnderMouse.clear();
        break;
    default:
        break;
    }

    switch (event->type()) {
    case QEvent::GraphicsSceneDragEnter:
        dragEnterEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneDragMove:
        dragMoveEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneDragLeave:
        dragLeaveEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneDrop:
        dropEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneContextMenu:
        contextMenuEvent(static_cast<QGraphicsSceneContextMenuEvent *>(event));
        break;
    case QEvent::KeyPress:
        if (!d->focusItem) {
            QKeyEvent *k = static_cast<QKeyEvent *>(event);
            if (k->key() == Qt::Key_Tab || k->key() == Qt::Key_Backtab) {
                if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
                    bool res = false;
                    if (k->key() == Qt::Key_Backtab
                        || (k->key() == Qt::Key_Tab && (k->modifiers() & Qt::ShiftModifier))) {
                        res = focusNextPrevChild(false);
                    } else if (k->key() == Qt::Key_Tab) {
                        res = focusNextPrevChild(true);
                    }
                    if (!res)
                        event->ignore();
                    return true;
                }
            }
        }
        keyPressEvent(static_cast<QKeyEvent *>(event));
        break;
    case QEvent::KeyRelease:
        keyReleaseEvent(static_cast<QKeyEvent *>(event));
        break;
    case QEvent::ShortcutOverride: {
            QGraphicsItem *parent = focusItem();
            while (parent) {
                d->sendEvent(parent, event);
                if (event->isAccepted())
                    return true;
                parent = parent->parentItem();
            }
        }
        return false;
    case QEvent::GraphicsSceneMouseMove:
    {
        QGraphicsSceneMouseEvent *mouseEvent = static_cast<QGraphicsSceneMouseEvent *>(event);
        d->lastSceneMousePos = mouseEvent->scenePos();
        mouseMoveEvent(mouseEvent);
        break;
    }
    case QEvent::GraphicsSceneMousePress:
        mousePressEvent(static_cast<QGraphicsSceneMouseEvent *>(event));
        break;
    case QEvent::GraphicsSceneMouseRelease:
        mouseReleaseEvent(static_cast<QGraphicsSceneMouseEvent *>(event));
        break;
    case QEvent::GraphicsSceneMouseDoubleClick:
        mouseDoubleClickEvent(static_cast<QGraphicsSceneMouseEvent *>(event));
        break;
    case QEvent::GraphicsSceneWheel:
        wheelEvent(static_cast<QGraphicsSceneWheelEvent *>(event));
        break;
    case QEvent::FocusIn:
        focusInEvent(static_cast<QFocusEvent *>(event));
        break;
    case QEvent::FocusOut:
        focusOutEvent(static_cast<QFocusEvent *>(event));
        break;
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverLeave:
    case QEvent::GraphicsSceneHoverMove:
    {
        QGraphicsSceneHoverEvent *hoverEvent = static_cast<QGraphicsSceneHoverEvent *>(event);
        d->lastSceneMousePos = hoverEvent->scenePos();
        d->dispatchHoverEvent(hoverEvent);
        break;
    }
    case QEvent::Leave:
        Q_ASSERT_X(false, "QGraphicsScene::event",
                   "QGraphicsScene must not receive QEvent::Leave, use GraphicsSceneLeave");
        break;
    case QEvent::GraphicsSceneLeave:
    {
        auto *leaveEvent = static_cast<QGraphicsSceneEvent*>(event);
        d->leaveScene(leaveEvent->widget());
        break;
    }
    case QEvent::GraphicsSceneHelp:
        helpEvent(static_cast<QGraphicsSceneHelpEvent *>(event));
        break;
    case QEvent::InputMethod:
        inputMethodEvent(static_cast<QInputMethodEvent *>(event));
        break;
    case QEvent::WindowActivate:
        if (!d->activationRefCount++) {
            if (d->lastActivePanel) {
                // Activate the last panel.
                d->setActivePanelHelper(d->lastActivePanel, true);
            } else if (d->tabFocusFirst && d->tabFocusFirst->isPanel()) {
                // Activate the panel of the first item in the tab focus
                // chain.
                d->setActivePanelHelper(d->tabFocusFirst, true);
            } else {
                // Activate all toplevel items.
                QEvent event(QEvent::WindowActivate);
                const auto items_ = items();
                for (QGraphicsItem *item : items_) {
                    if (item->isVisible() && !item->isPanel() && !item->parentItem())
                        sendEvent(item, &event);
                }
            }
        }
        break;
    case QEvent::WindowDeactivate:
        if (!--d->activationRefCount) {
            if (d->activePanel) {
                // Deactivate the active panel (but keep it so we can
                // reactivate it later).
                QGraphicsItem *lastActivePanel = d->activePanel;
                d->setActivePanelHelper(nullptr, true);
                d->lastActivePanel = lastActivePanel;
            } else {
                // Activate all toplevel items.
                QEvent event(QEvent::WindowDeactivate);
                const auto items_ = items();
                for (QGraphicsItem *item : items_) {
                    if (item->isVisible() && !item->isPanel() && !item->parentItem())
                        sendEvent(item, &event);
                }
            }
        }
        break;
    case QEvent::ApplicationFontChange: {
        // Resolve the existing scene font.
        d->resolveFont();
        break;
    }
    case QEvent::FontChange:
        // Update the entire scene when the font changes.
        update();
        break;
    case QEvent::ApplicationPaletteChange: {
        // Resolve the existing scene palette.
        d->resolvePalette();
        break;
    }
    case QEvent::PaletteChange:
        // Update the entire scene when the palette changes.
        update();
        break;
    case QEvent::StyleChange:
        // Reresolve all widgets' styles. Update all top-level widgets'
        // geometries that do not have an explicit style set.
        update();
        break;
    case QEvent::StyleAnimationUpdate:
        // Because QGraphicsItem is not a QObject, QStyle driven
        // animations are forced to update the whole scene
        update();
        break;
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        d->touchEventHandler(static_cast<QTouchEvent *>(event));
        break;
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    case QEvent::GestureOverride:
        d->gestureEventHandler(static_cast<QGestureEvent *>(event));
        break;
#endif // QT_NO_GESTURES
    default:
        return QObject::event(event);
    }
    return true;
}